

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int removefrom_hashtable(hash_table_t *table,hash_key_t key)

{
  hash_entry_t *phVar1;
  hash_entry_t *phVar2;
  int iVar3;
  hash_entry_t *entry;
  hash_entry_t *local_10;
  
  local_10 = (hash_entry_t *)0x0;
  iVar3 = lookup(table,key,&local_10);
  if (iVar3 == -1) {
    iVar3 = -1;
  }
  else {
    local_10->key = (hash_key_t)0x0;
    local_10->data = (hash_data_t)0x0;
    local_10->hash_value = 0;
    local_10->status = 1;
    phVar1 = local_10->next;
    phVar2 = local_10->prev;
    if (phVar1 != (hash_entry_t *)0x0) {
      phVar1->prev = phVar2;
    }
    if (phVar2 != (hash_entry_t *)0x0) {
      phVar2->next = phVar1;
    }
    if (table->head == local_10) {
      table->head = local_10->next;
    }
    table->entry_count = table->entry_count - 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int removefrom_hashtable(hash_table_t *table, hash_key_t key) {
  hash_entry_t *entry = NULL;
  int result = 0;

  result = lookup(table, key, &entry);
  if (result == -1) return -1;

  entry->key = NULL;
  entry->data = NULL;
  entry->hash_value = 0;
  entry->status = TOMBSTONE;
  if (entry->next) entry->next->prev = entry->prev;
  if (entry->prev) entry->prev->next = entry->next;
  if (table->head == entry) table->head = entry->next;
  // Do not set entry->next to NULL, which would break the iterate & delete
  // idiom used under dlopen_wrapper.

  table->entry_count--;
  return 0;
}